

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

RayDifferential * __thiscall
pbrt::Interaction::SpawnRay(RayDifferential *__return_storage_ptr__,Interaction *this,Vector3f *d)

{
  float fVar1;
  Float FVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  uintptr_t uVar7;
  undefined1 auVar8 [16];
  MediumHandle *pMVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Point3f PVar14;
  
  auVar11 = in_ZMM0._8_56_;
  PVar14 = OffsetRayOrigin(this,d);
  auVar10._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  uVar4 = (d->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar6 = (d->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar12._4_4_ = uVar6;
  auVar12._0_4_ = uVar4;
  auVar12._8_8_ = 0;
  fVar1 = (d->super_Tuple3<pbrt::Vector3,_float>).z;
  FVar2 = this->time;
  if (this->mediumInterface == (MediumInterface *)0x0) {
    pMVar9 = &this->medium;
  }
  else {
    fVar3 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
    auVar13 = ZEXT416((uint)(fVar1 * fVar3));
    auVar8 = vfmadd132ss_fma(ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.y),auVar13,
                             ZEXT416((uint)(d->super_Tuple3<pbrt::Vector3,_float>).y));
    auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar1),auVar13);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar13._0_4_)),
                             ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.x),
                             ZEXT416((uint)(d->super_Tuple3<pbrt::Vector3,_float>).x));
    pMVar9 = &this->mediumInterface->inside + (0.0 < auVar8._0_4_);
  }
  uVar7 = (pMVar9->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  uVar5 = vmovlps_avx(auVar10._0_16_);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  uVar5 = vmovlps_avx(auVar12);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  (__return_storage_ptr__->super_Ray).time = FVar2;
  (__return_storage_ptr__->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar7;
  __return_storage_ptr__->hasDifferentials = false;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

SpawnRay(const Vector3f &d) const {
        return RayDifferential(OffsetRayOrigin(d), d, time, GetMedium(d));
    }